

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_b963::read_iostream_prealloc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  size_type __n;
  allocator_type local_221;
  ifstream file;
  
  std::ifstream::ifstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::ifstream::open((char *)&file,(_Ios_Openmode)file_name);
  std::istream::seekg((long)&file,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg(&file,0,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_221);
  std::istream::read((char *)&file,
                     (long)(__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_iostream_prealloc(const char* file_name)
{
    std::ifstream file{};
    file.exceptions(std::ios::badbit);
    file.open(file_name, std::ios_base::binary);

    file.seekg(0, std::ios_base::end);
    auto file_size = file.tellg();
    file.seekg(0);
    std::vector<std::uint8_t> output(file_size);

    file.read(reinterpret_cast<char*>(output.data()), file_size);

    return output;
}